

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule7Test::verifyResultData
          (TessellationShaderInvarianceRule7Test *this,void **all_iterations_data)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  _tessellation_primitive_mode primitive_mode_00;
  size_type sVar5;
  reference ppfVar6;
  TestLog *this_00;
  MessageBuilder *pMVar7;
  TestError *this_01;
  bool is_triangles_iteration_00;
  float fVar8;
  _test_iterations *local_2c8;
  int local_2bc;
  MessageBuilder local_2a8;
  char *local_128;
  char *primitive_mode_str;
  uint local_118;
  bool y_is_1;
  bool y_is_0;
  bool x_is_1;
  bool x_is_0;
  uint n_vertex;
  bool is_left_outer_edge;
  bool is_bottom_outer_edge;
  bool is_right_outer_edge;
  bool is_top_outer_edge;
  vector<const_float_*,_std::allocator<const_float_*>_> outer_edge_vertices;
  size_t n_outer_edge_vertices;
  uint n_base_tess_level;
  uint n_outer_edge_vertices_found;
  bool is_base_triangle_vertex3_outer;
  bool is_base_triangle_vertex2_outer;
  bool is_base_triangle_vertex1_outer;
  float *base_triangle_vertex3;
  float *base_triangle_vertex2;
  float *base_triangle_vertex1;
  float *base_triangle_data;
  float *pfStack_b8;
  uint n_base_triangle;
  float *ref_iteration_vertex_data;
  float *base_iteration_vertex_data;
  _test_iteration *ref_iteration;
  int *n_ref_test_iteration;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  const_iterator ref_iteration_iterator;
  uint ref_iteration_index;
  uint n_modified_outer_tess_level;
  uint n_reference_iteration;
  vector<int,_std::allocator<int>_> ref_iteration_indices;
  _test_iteration *base_iteration;
  uint n_base_test_iteration;
  _test_iterations *test_iterations;
  _tessellation_primitive_mode primitive_mode;
  uint n_relevant_outer_tess_levels;
  uint n_base_iteration;
  bool is_triangles_iteration;
  uint n_iteration;
  float epsilon;
  void **all_iterations_data_local;
  TessellationShaderInvarianceRule7Test *this_local;
  
  n_base_iteration = 0;
  do {
    if (1 < n_base_iteration) {
      return;
    }
    is_triangles_iteration_00 = n_base_iteration == 0;
    if (n_base_iteration == 0) {
      local_2bc = 0;
    }
    else {
      sVar5 = std::
              vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
              ::size(&this->m_test_triangles_iterations);
      local_2bc = (int)sVar5;
    }
    uVar4 = 4;
    if (is_triangles_iteration_00) {
      uVar4 = 3;
    }
    primitive_mode_00 = TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;
    if (n_base_iteration == 0) {
      primitive_mode_00 = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
      local_2c8 = &this->m_test_triangles_iterations;
    }
    else {
      local_2c8 = &this->m_test_quads_iterations;
    }
    for (base_iteration._4_4_ = 0;
        sVar5 = std::
                vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                ::size(local_2c8), base_iteration._4_4_ < sVar5;
        base_iteration._4_4_ = base_iteration._4_4_ + 1) {
      ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)std::
                    vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
                    ::operator[](local_2c8,(ulong)base_iteration._4_4_);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&n_reference_iteration);
      if ((*(byte *)(ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 8) & 1) != 0) {
        for (ref_iteration_index = 0; ref_iteration_index < uVar4;
            ref_iteration_index = ref_iteration_index + 1) {
          ref_iteration_iterator._M_current._0_4_ =
               getTestIterationIndex
                         (this,is_triangles_iteration_00,
                          (float *)ref_iteration_indices.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                          (float *)(ref_iteration_indices.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage + 2),
                          ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage[7],
                          (ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage[9] + 1 +
                          ref_iteration_index) % uVar4);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&n_reference_iteration,
                     (value_type_conflict1 *)&ref_iteration_iterator);
        }
        local_90._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)&n_reference_iteration);
        __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
        __normal_iterator<int*>
                  ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_88,
                   &local_90);
        while( true ) {
          n_ref_test_iteration =
               (int *)std::vector<int,_std::allocator<int>_>::end
                                ((vector<int,_std::allocator<int>_> *)&n_reference_iteration);
          bVar1 = __gnu_cxx::operator!=
                            (&local_88,
                             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                             &n_ref_test_iteration);
          if (!bVar1) break;
          ref_iteration =
               (_test_iteration *)
               __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_88);
          base_iteration_vertex_data =
               std::
               vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
               ::operator[](local_2c8,(long)(int)ref_iteration->inner_tess_levels[0])->
               inner_tess_levels;
          ref_iteration_vertex_data = (float *)all_iterations_data[local_2bc + base_iteration._4_4_]
          ;
          pfStack_b8 = (float *)all_iterations_data
                                [(uint)(local_2bc + (int)ref_iteration->inner_tess_levels[0])];
          for (base_triangle_data._4_4_ = 0;
              base_triangle_data._4_4_ <
              (uint)ref_iteration_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage[10] / 3;
              base_triangle_data._4_4_ = base_triangle_data._4_4_ + 1) {
            base_triangle_vertex2 = ref_iteration_vertex_data + base_triangle_data._4_4_ * 9;
            base_triangle_vertex3 = base_triangle_vertex2 + 3;
            _n_outer_edge_vertices_found = base_triangle_vertex2 + 6;
            base_triangle_vertex1 = base_triangle_vertex2;
            bVar1 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode_00,base_triangle_vertex2);
            bVar2 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode_00,base_triangle_vertex3);
            bVar3 = TessellationShaderUtils::isOuterEdgeVertex
                              (primitive_mode_00,_n_outer_edge_vertices_found);
            if ((char)(bVar3 + bVar2 + bVar1) != '\0') {
              if (primitive_mode_00 == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) {
                if ((((bVar1) &&
                     (((!bVar1 || (*base_triangle_vertex2 != 0.0)) || (NAN(*base_triangle_vertex2)))
                     )) || ((bVar2 && (((!bVar2 || (*base_triangle_vertex3 != 0.0)) ||
                                       (NAN(*base_triangle_vertex3))))))) ||
                   ((bVar3 && (((!bVar3 || (*_n_outer_edge_vertices_found != 0.0)) ||
                               (NAN(*_n_outer_edge_vertices_found))))))) {
                  if ((((bVar1) &&
                       (((!bVar1 || (base_triangle_vertex2[1] != 0.0)) ||
                        (NAN(base_triangle_vertex2[1]))))) ||
                      ((bVar2 && (((!bVar2 || (base_triangle_vertex3[1] != 0.0)) ||
                                  (NAN(base_triangle_vertex3[1]))))))) ||
                     ((bVar3 && (((!bVar3 || (_n_outer_edge_vertices_found[1] != 0.0)) ||
                                 (NAN(_n_outer_edge_vertices_found[1]))))))) {
                    n_outer_edge_vertices._4_4_ = 2.8026e-45;
                  }
                  else {
                    n_outer_edge_vertices._4_4_ = 1.4013e-45;
                  }
                }
                else {
                  n_outer_edge_vertices._4_4_ = 0.0;
                }
              }
              else {
                outer_edge_vertices.
                super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
                          ((vector<const_float_*,_std::allocator<const_float_*>_> *)&n_vertex);
                if (bVar1) {
                  std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
                            ((vector<const_float_*,_std::allocator<const_float_*>_> *)&n_vertex,
                             &base_triangle_vertex2);
                }
                if (bVar2) {
                  std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
                            ((vector<const_float_*,_std::allocator<const_float_*>_> *)&n_vertex,
                             &base_triangle_vertex3);
                }
                if (bVar3) {
                  std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
                            ((vector<const_float_*,_std::allocator<const_float_*>_> *)&n_vertex,
                             (value_type *)&n_outer_edge_vertices_found);
                }
                outer_edge_vertices.
                super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)std::vector<const_float_*,_std::allocator<const_float_*>_>::size
                                        ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                         &n_vertex);
                x_is_0 = true;
                x_is_1 = true;
                y_is_0 = true;
                y_is_1 = true;
                for (local_118 = 0;
                    (pointer)(ulong)local_118 <
                    outer_edge_vertices.
                    super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage; local_118 = local_118 + 1) {
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,(ulong)local_118);
                  fVar8 = de::abs<float>((*ppfVar6)[1] + -1.0);
                  if (1e-05 < fVar8) {
                    x_is_0 = false;
                  }
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,(ulong)local_118);
                  fVar8 = de::abs<float>(**ppfVar6 + -1.0);
                  if (1e-05 < fVar8) {
                    x_is_1 = false;
                  }
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,(ulong)local_118);
                  fVar8 = de::abs<float>((*ppfVar6)[1]);
                  if (1e-05 < fVar8) {
                    y_is_0 = false;
                  }
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,(ulong)local_118);
                  fVar8 = de::abs<float>(**ppfVar6);
                  if (1e-05 < fVar8) {
                    y_is_1 = false;
                  }
                }
                if (outer_edge_vertices.
                    super__Vector_base<const_float_*,_std::allocator<const_float_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage == (pointer)&DAT_00000001) {
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,0);
                  fVar8 = de::abs<float>(**ppfVar6);
                  primitive_mode_str._7_1_ = fVar8 < 1e-05;
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,0);
                  fVar8 = de::abs<float>(**ppfVar6 + -1.0);
                  primitive_mode_str._6_1_ = fVar8 < 1e-05;
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,0);
                  fVar8 = de::abs<float>((*ppfVar6)[1]);
                  primitive_mode_str._5_1_ = fVar8 < 1e-05;
                  ppfVar6 = std::vector<const_float_*,_std::allocator<const_float_*>_>::operator[]
                                      ((vector<const_float_*,_std::allocator<const_float_*>_> *)
                                       &n_vertex,0);
                  fVar8 = de::abs<float>((*ppfVar6)[1] + -1.0);
                  primitive_mode_str._4_1_ = fVar8 < 1e-05;
                  if (((primitive_mode_str._7_1_ & 1) == 0) || ((primitive_mode_str._5_1_ & 1) == 0)
                     ) {
                    if (((primitive_mode_str._7_1_ & 1) == 0) || (!(bool)primitive_mode_str._4_1_))
                    {
                      if (((primitive_mode_str._6_1_ & 1) == 0) ||
                         ((primitive_mode_str._5_1_ & 1) == 0)) {
                        if (((primitive_mode_str._6_1_ & 1) != 0) &&
                           ((bool)primitive_mode_str._4_1_)) {
                          x_is_1 = false;
                        }
                      }
                      else {
                        y_is_0 = false;
                      }
                    }
                    else {
                      x_is_0 = false;
                    }
                  }
                  else {
                    y_is_1 = false;
                  }
                }
                if ((y_is_1 & 1U) == 0) {
                  if ((y_is_0 & 1U) == 0) {
                    if ((x_is_1 & 1U) == 0) {
                      n_outer_edge_vertices._4_4_ = 4.2039e-45;
                    }
                    else {
                      n_outer_edge_vertices._4_4_ = 2.8026e-45;
                    }
                  }
                  else {
                    n_outer_edge_vertices._4_4_ = 1.4013e-45;
                  }
                }
                else {
                  n_outer_edge_vertices._4_4_ = 0.0;
                }
                std::vector<const_float_*,_std::allocator<const_float_*>_>::~vector
                          ((vector<const_float_*,_std::allocator<const_float_*>_> *)&n_vertex);
              }
              if ((n_outer_edge_vertices._4_4_ != base_iteration_vertex_data[9]) &&
                 (bVar1 = isTriangleDefinedInVertexDataSet
                                    (this,base_triangle_vertex1,pfStack_b8,
                                     (uint)base_iteration_vertex_data[10]), !bVar1)) {
                local_128 = "quads";
                if (is_triangles_iteration_00) {
                  local_128 = "triangles";
                }
                this_00 = tcu::TestContext::getLog
                                    ((this->super_TessellationShaderInvarianceBaseTest).
                                     super_TestCaseBase.super_TestCase.super_TestNode.m_testCtx);
                tcu::TestLog::operator<<
                          (&local_2a8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (&local_2a8,(char (*) [21])"For primitive mode [");
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_128);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a1cf32);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(char (*) [29])", inner tessellation levels:");
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c3fdfc);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(float *)ref_iteration_indices.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data.
                                                    _M_end_of_storage);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(float *)(ref_iteration_indices.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 1));
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(char (*) [30])"], outer tessellation levels:");
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c3fdfc);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(float *)(ref_iteration_indices.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 2));
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(float *)(ref_iteration_indices.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 3));
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(float *)(ref_iteration_indices.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 4));
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(float *)(ref_iteration_indices.
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data.
                                                     _M_end_of_storage + 5));
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(char (*) [46])
                                           "], a triangle connecting inner & outer edges:");
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c3fdfc);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,base_triangle_vertex2);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,base_triangle_vertex2 + 1);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,base_triangle_vertex2 + 2);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"]x");
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c3fdfc);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,base_triangle_vertex3);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,base_triangle_vertex3 + 1);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,base_triangle_vertex3 + 2);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])"]x");
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x2c3fdfc);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,_n_outer_edge_vertices_found);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,_n_outer_edge_vertices_found + 1);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a4b1eb);
                pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,_n_outer_edge_vertices_found + 2);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (pMVar7,(char (*) [114])
                                           "] was not found for runs using CW and CCW vertex ordering, which is against the extension specification\'s rule 7."
                                   );
                tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_2a8);
                this_01 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this_01,"Implementation is not conformant with Tessellation Rule 7",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                           ,0xc3d);
                __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
            }
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_88,0);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&n_reference_iteration);
    }
    n_base_iteration = n_base_iteration + 1;
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule7Test::verifyResultData(const void** all_iterations_data)
{
	const float epsilon = 1e-5f;

	/* Run two separate iterations:
	 *
	 * a) triangles
	 * b) quads
	 */
	for (unsigned int n_iteration = 0; n_iteration < 2 /* triangles, quads */; ++n_iteration)
	{
		bool			   is_triangles_iteration = (n_iteration == 0);
		const unsigned int n_base_iteration =
			(n_iteration == 0) ? 0 : (const unsigned int)m_test_triangles_iterations.size();
		const unsigned int n_relevant_outer_tess_levels = (is_triangles_iteration) ? 3 : 4;

		_tessellation_primitive_mode primitive_mode = (n_iteration == 0) ?
														  TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES :
														  TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS;

		const _test_iterations& test_iterations =
			(n_iteration == 0) ? m_test_triangles_iterations : m_test_quads_iterations;

		DE_ASSERT(test_iterations.size() != 0);

		/* Find a base iteration first */
		for (unsigned int n_base_test_iteration = 0; n_base_test_iteration < test_iterations.size();
			 n_base_test_iteration++)
		{
			const _test_iteration& base_iteration = test_iterations[n_base_test_iteration];
			std::vector<int>	   ref_iteration_indices;

			if (!base_iteration.is_base_iteration)
			{
				continue;
			}

			/* Retrieve reference test iterations */
			for (unsigned int n_reference_iteration = 0; n_reference_iteration < n_relevant_outer_tess_levels;
				 ++n_reference_iteration)
			{
				const unsigned int n_modified_outer_tess_level =
					(base_iteration.n_modified_outer_tess_level + n_reference_iteration + 1) %
					n_relevant_outer_tess_levels;
				const unsigned int ref_iteration_index = getTestIterationIndex(
					is_triangles_iteration, base_iteration.inner_tess_levels, base_iteration.outer_tess_levels,
					base_iteration.vertex_ordering, n_modified_outer_tess_level);

				DE_ASSERT(ref_iteration_index != 0xFFFFFFFF);
				DE_ASSERT(ref_iteration_index != n_base_test_iteration);

				ref_iteration_indices.push_back(ref_iteration_index);
			}

			/* We can now start comparing base data with the information generated for
			 * reference iterations. */
			for (std::vector<int>::const_iterator ref_iteration_iterator = ref_iteration_indices.begin();
				 ref_iteration_iterator != ref_iteration_indices.end(); ref_iteration_iterator++)
			{
				const int&			   n_ref_test_iteration = *ref_iteration_iterator;
				const _test_iteration& ref_iteration		= test_iterations[n_ref_test_iteration];

				/* Now move through all triangles generated for base test iteration. Focus on the ones
				 * that connect the outer edge with one of the inner ones */
				const float* base_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_base_test_iteration];
				const float* ref_iteration_vertex_data =
					(const float*)all_iterations_data[n_base_iteration + n_ref_test_iteration];

				for (unsigned int n_base_triangle = 0;
					 n_base_triangle < base_iteration.n_vertices / 3; /* vertices per triangle */
					 ++n_base_triangle)
				{
					const float* base_triangle_data =
						base_iteration_vertex_data + n_base_triangle * 3 /* vertices */ * 3; /* components */

					/* Is that the triangle type we're after? */
					const float* base_triangle_vertex1 = base_triangle_data;
					const float* base_triangle_vertex2 = base_triangle_vertex1 + 3; /* components */
					const float* base_triangle_vertex3 = base_triangle_vertex2 + 3; /* components */
					bool		 is_base_triangle_vertex1_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex1);
					bool is_base_triangle_vertex2_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex2);
					bool is_base_triangle_vertex3_outer =
						TessellationShaderUtils::isOuterEdgeVertex(primitive_mode, base_triangle_vertex3);
					unsigned int n_outer_edge_vertices_found = 0;

					n_outer_edge_vertices_found += (is_base_triangle_vertex1_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex2_outer == true);
					n_outer_edge_vertices_found += (is_base_triangle_vertex3_outer == true);

					if (n_outer_edge_vertices_found == 0)
					{
						/* This is an inner triangle, not really of our interest */
						continue;
					}

					/* Which outer tessellation level describes the base data edge? */
					unsigned int n_base_tess_level = 0;

					if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
					{
						if ((!is_base_triangle_vertex1_outer ||
							 (is_base_triangle_vertex1_outer && base_triangle_vertex1[0] == 0.0f)) &&
							(!is_base_triangle_vertex2_outer ||
							 (is_base_triangle_vertex2_outer && base_triangle_vertex2[0] == 0.0f)) &&
							(!is_base_triangle_vertex3_outer ||
							 (is_base_triangle_vertex3_outer && base_triangle_vertex3[0] == 0.0f)))
						{
							n_base_tess_level = 0;
						}
						else if ((!is_base_triangle_vertex1_outer ||
								  (is_base_triangle_vertex1_outer && base_triangle_vertex1[1] == 0.0f)) &&
								 (!is_base_triangle_vertex2_outer ||
								  (is_base_triangle_vertex2_outer && base_triangle_vertex2[1] == 0.0f)) &&
								 (!is_base_triangle_vertex3_outer ||
								  (is_base_triangle_vertex3_outer && base_triangle_vertex3[1] == 0.0f)))
						{
							n_base_tess_level = 1;
						}
						else
						{
							DE_ASSERT((!is_base_triangle_vertex1_outer ||
									   (is_base_triangle_vertex1_outer && base_triangle_vertex1[2] == 0.0f)) &&
									  (!is_base_triangle_vertex2_outer ||
									   (is_base_triangle_vertex2_outer && base_triangle_vertex2[2] == 0.0f)) &&
									  (!is_base_triangle_vertex3_outer ||
									   (is_base_triangle_vertex3_outer && base_triangle_vertex3[2] == 0.0f)));

							n_base_tess_level = 2;
						}
					} /* if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES) */
					else
					{
						DE_ASSERT(primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS);

						std::size_t				  n_outer_edge_vertices = 0;
						std::vector<const float*> outer_edge_vertices;

						if (is_base_triangle_vertex1_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex1);
						}

						if (is_base_triangle_vertex2_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex2);
						}

						if (is_base_triangle_vertex3_outer)
						{
							outer_edge_vertices.push_back(base_triangle_vertex3);
						}

						n_outer_edge_vertices = outer_edge_vertices.size();

						DE_ASSERT(n_outer_edge_vertices >= 1 && n_outer_edge_vertices <= 2);

						bool is_top_outer_edge	= true;
						bool is_right_outer_edge  = true;
						bool is_bottom_outer_edge = true;
						bool is_left_outer_edge   = true;

						/* Find which outer edges the vertices don't belong to. If one is in a corner,
						 * the other will clarify to which edge both vertices belong. */
						for (unsigned int n_vertex = 0; n_vertex < n_outer_edge_vertices; ++n_vertex)
						{
							/* Y < 1, not top outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1] - 1.0f) > epsilon)
							{
								is_top_outer_edge = false;
							}

							/* X < 1, not right outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0] - 1.0f) > epsilon)
							{
								is_right_outer_edge = false;
							}

							/* Y > 0, not bottom outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][1]) > epsilon)
							{
								is_bottom_outer_edge = false;
							}

							/* X > 0, not left outer edge */
							if (de::abs(outer_edge_vertices[n_vertex][0]) > epsilon)
							{
								is_left_outer_edge = false;
							}
						}

						if (n_outer_edge_vertices == 1)
						{
							/* A single vertex with corner-coordinates belongs to two edges. Choose one */
							bool x_is_0 = de::abs(outer_edge_vertices[0][0]) < epsilon;
							bool x_is_1 = de::abs(outer_edge_vertices[0][0] - 1.0f) < epsilon;
							bool y_is_0 = de::abs(outer_edge_vertices[0][1]) < epsilon;
							bool y_is_1 = de::abs(outer_edge_vertices[0][1] - 1.0f) < epsilon;

							if (x_is_0 && y_is_0)
							{
								/* bottom edge */
								DE_ASSERT(is_left_outer_edge && is_bottom_outer_edge);
								is_left_outer_edge = false;
							}
							else if (x_is_0 && y_is_1)
							{
								/* left edge */
								DE_ASSERT(is_left_outer_edge && is_top_outer_edge);
								is_top_outer_edge = false;
							}
							else if (x_is_1 && y_is_0)
							{
								/* right edge */
								DE_ASSERT(is_right_outer_edge && is_bottom_outer_edge);
								is_bottom_outer_edge = false;
							}
							else if (x_is_1 && y_is_1)
							{
								/* top edge */
								DE_ASSERT(is_right_outer_edge && is_top_outer_edge);
								is_right_outer_edge = false;
							}
							else
							{
								/* Not a corner vertex, only one of the edge-flags is set */
							}
						}

						/* Sanity checks */
						DE_UNREF(is_top_outer_edge);
						DE_ASSERT((is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && is_top_outer_edge && !is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && is_bottom_outer_edge &&
								   !is_right_outer_edge) ||
								  (!is_left_outer_edge && !is_top_outer_edge && !is_bottom_outer_edge &&
								   is_right_outer_edge));

						/* We have all the data needed to determine which tessellation level describes
						 * subdivision of the edge that the triangle touches */
						if (is_left_outer_edge)
						{
							n_base_tess_level = 0;
						}
						else if (is_bottom_outer_edge)
						{
							n_base_tess_level = 1;
						}
						else if (is_right_outer_edge)
						{
							n_base_tess_level = 2;
						}
						else
						{
							n_base_tess_level = 3;
						}
					}

					/* We shouldn't perform the check if the edge we're processing was described
					 * by a different outer tessellation level in the reference data set */
					if (n_base_tess_level == ref_iteration.n_modified_outer_tess_level)
					{
						continue;
					}

					/* This triangle should be present in both vertex data sets */
					if (!isTriangleDefinedInVertexDataSet(base_triangle_data, ref_iteration_vertex_data,
														  ref_iteration.n_vertices))
					{
						const char* primitive_mode_str = (is_triangles_iteration) ? "triangles" : "quads";

						m_testCtx.getLog()
							<< tcu::TestLog::Message << "For primitive mode [" << primitive_mode_str << "] "
							<< ", inner tessellation levels:"
							<< "[" << base_iteration.inner_tess_levels[0] << ", " << base_iteration.inner_tess_levels[1]
							<< "], outer tessellation levels:"
							<< "[" << base_iteration.outer_tess_levels[0] << ", " << base_iteration.outer_tess_levels[1]
							<< ", " << base_iteration.outer_tess_levels[2] << ", "
							<< base_iteration.outer_tess_levels[3] << "], a triangle connecting inner & outer edges:"
							<< "[" << base_triangle_vertex1[0] << ", " << base_triangle_vertex1[1] << ", "
							<< base_triangle_vertex1[2] << "]x"
							<< "[" << base_triangle_vertex2[0] << ", " << base_triangle_vertex2[1] << ", "
							<< base_triangle_vertex2[2] << "]x"
							<< "[" << base_triangle_vertex3[0] << ", " << base_triangle_vertex3[1] << ", "
							<< base_triangle_vertex3[2] << "] was not found for runs using CW and CCW vertex ordering, "
														   "which is against the extension specification's rule 7."
							<< tcu::TestLog::EndMessage;

						TCU_FAIL("Implementation is not conformant with Tessellation Rule 7");
					}
				} /* for (all triangles generated for base test iteration) */
			}	 /* for (all reference iterations) */
		}		  /* for (all base test iterations) */
	}			  /* for (both primitive types) */
}